

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O2

CURLcode Curl_initinfo(Curl_easy *data)

{
  undefined1 *puVar1;
  PureInfo *pPVar2;
  
  (data->progress).timespent = 0;
  (data->progress).t_nslookup = 0;
  (data->progress).t_connect = 0;
  (data->progress).t_appconnect = 0;
  (data->progress).t_pretransfer = 0;
  (data->progress).t_redirect = 0;
  (data->progress).t_posttransfer = 0;
  (data->progress).t_starttransfer = 0;
  puVar1 = &(data->progress).field_0x1ac;
  *puVar1 = *puVar1 & 0xfd;
  (data->info).httpcode = 0;
  (data->info).httpproxycode = 0;
  (data->info).httpversion = 0;
  (data->info).filetime = -1;
  puVar1 = &(data->info).field_0xf4;
  *puVar1 = *puVar1 & 0xfe;
  (data->info).header_size = 0;
  (data->info).request_size = 0;
  (data->info).proxyauthavail = 0;
  (data->info).httpauthavail = 0;
  (data->info).proxyauthpicked = 0;
  (data->info).httpauthpicked = 0;
  (data->info).numconnects = 0;
  (*Curl_cfree)((data->info).contenttype);
  (data->info).contenttype = (char *)0x0;
  (*Curl_cfree)((data->info).wouldredirect);
  (data->info).wouldredirect = (char *)0x0;
  (data->info).retry_after = 0;
  (data->info).primary.remote_ip[0] = '\0';
  (data->info).primary.remote_ip[1] = '\0';
  (data->info).primary.remote_ip[2] = '\0';
  (data->info).primary.remote_ip[3] = '\0';
  (data->info).primary.remote_ip[4] = '\0';
  (data->info).primary.remote_ip[5] = '\0';
  (data->info).primary.remote_ip[6] = '\0';
  (data->info).primary.remote_ip[7] = '\0';
  pPVar2 = &data->info;
  (pPVar2->primary).remote_ip[8] = '\0';
  (pPVar2->primary).remote_ip[9] = '\0';
  (pPVar2->primary).remote_ip[10] = '\0';
  (pPVar2->primary).remote_ip[0xb] = '\0';
  (pPVar2->primary).remote_ip[0xc] = '\0';
  (pPVar2->primary).remote_ip[0xd] = '\0';
  (pPVar2->primary).remote_ip[0xe] = '\0';
  (pPVar2->primary).remote_ip[0xf] = '\0';
  pPVar2 = &data->info;
  (pPVar2->primary).remote_ip[0x10] = '\0';
  (pPVar2->primary).remote_ip[0x11] = '\0';
  (pPVar2->primary).remote_ip[0x12] = '\0';
  (pPVar2->primary).remote_ip[0x13] = '\0';
  (pPVar2->primary).remote_ip[0x14] = '\0';
  (pPVar2->primary).remote_ip[0x15] = '\0';
  (pPVar2->primary).remote_ip[0x16] = '\0';
  (pPVar2->primary).remote_ip[0x17] = '\0';
  pPVar2 = &data->info;
  (pPVar2->primary).remote_ip[0x18] = '\0';
  (pPVar2->primary).remote_ip[0x19] = '\0';
  (pPVar2->primary).remote_ip[0x1a] = '\0';
  (pPVar2->primary).remote_ip[0x1b] = '\0';
  (pPVar2->primary).remote_ip[0x1c] = '\0';
  (pPVar2->primary).remote_ip[0x1d] = '\0';
  (pPVar2->primary).remote_ip[0x1e] = '\0';
  (pPVar2->primary).remote_ip[0x1f] = '\0';
  pPVar2 = &data->info;
  (pPVar2->primary).remote_ip[0x20] = '\0';
  (pPVar2->primary).remote_ip[0x21] = '\0';
  (pPVar2->primary).remote_ip[0x22] = '\0';
  (pPVar2->primary).remote_ip[0x23] = '\0';
  (pPVar2->primary).remote_ip[0x24] = '\0';
  (pPVar2->primary).remote_ip[0x25] = '\0';
  (pPVar2->primary).remote_ip[0x26] = '\0';
  (pPVar2->primary).remote_ip[0x27] = '\0';
  *(undefined8 *)((data->info).primary.remote_ip + 0x28) = 0;
  pPVar2 = &data->info;
  (pPVar2->primary).local_ip[2] = '\0';
  (pPVar2->primary).local_ip[3] = '\0';
  (pPVar2->primary).local_ip[4] = '\0';
  (pPVar2->primary).local_ip[5] = '\0';
  (pPVar2->primary).local_ip[6] = '\0';
  (pPVar2->primary).local_ip[7] = '\0';
  (pPVar2->primary).local_ip[8] = '\0';
  (pPVar2->primary).local_ip[9] = '\0';
  pPVar2 = &data->info;
  (pPVar2->primary).local_ip[10] = '\0';
  (pPVar2->primary).local_ip[0xb] = '\0';
  (pPVar2->primary).local_ip[0xc] = '\0';
  (pPVar2->primary).local_ip[0xd] = '\0';
  (pPVar2->primary).local_ip[0xe] = '\0';
  (pPVar2->primary).local_ip[0xf] = '\0';
  (pPVar2->primary).local_ip[0x10] = '\0';
  (pPVar2->primary).local_ip[0x11] = '\0';
  pPVar2 = &data->info;
  (pPVar2->primary).local_ip[0x12] = '\0';
  (pPVar2->primary).local_ip[0x13] = '\0';
  (pPVar2->primary).local_ip[0x14] = '\0';
  (pPVar2->primary).local_ip[0x15] = '\0';
  (pPVar2->primary).local_ip[0x16] = '\0';
  (pPVar2->primary).local_ip[0x17] = '\0';
  (pPVar2->primary).local_ip[0x18] = '\0';
  (pPVar2->primary).local_ip[0x19] = '\0';
  pPVar2 = &data->info;
  (pPVar2->primary).local_ip[0x1a] = '\0';
  (pPVar2->primary).local_ip[0x1b] = '\0';
  (pPVar2->primary).local_ip[0x1c] = '\0';
  (pPVar2->primary).local_ip[0x1d] = '\0';
  (pPVar2->primary).local_ip[0x1e] = '\0';
  (pPVar2->primary).local_ip[0x1f] = '\0';
  (pPVar2->primary).local_ip[0x20] = '\0';
  (pPVar2->primary).local_ip[0x21] = '\0';
  pPVar2 = &data->info;
  (pPVar2->primary).local_ip[0x1e] = '\0';
  (pPVar2->primary).local_ip[0x1f] = '\0';
  (pPVar2->primary).local_ip[0x20] = '\0';
  (pPVar2->primary).local_ip[0x21] = '\0';
  (pPVar2->primary).local_ip[0x22] = '\0';
  (pPVar2->primary).local_ip[0x23] = '\0';
  (pPVar2->primary).local_ip[0x24] = '\0';
  (pPVar2->primary).local_ip[0x25] = '\0';
  pPVar2 = &data->info;
  (pPVar2->primary).local_ip[0x26] = '\0';
  (pPVar2->primary).local_ip[0x27] = '\0';
  (pPVar2->primary).local_ip[0x28] = '\0';
  (pPVar2->primary).local_ip[0x29] = '\0';
  (pPVar2->primary).local_ip[0x2a] = '\0';
  (pPVar2->primary).local_ip[0x2b] = '\0';
  (pPVar2->primary).local_ip[0x2c] = '\0';
  (pPVar2->primary).local_ip[0x2d] = '\0';
  (data->info).primary.remote_port = -1;
  (data->info).primary.local_port = -1;
  (data->info).conn_scheme = (char *)0x0;
  (data->info).conn_protocol = 0;
  Curl_ssl_free_certinfo(data);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_initinfo(struct Curl_easy *data)
{
  struct Progress *pro = &data->progress;
  struct PureInfo *info = &data->info;

  pro->t_nslookup = 0;
  pro->t_connect = 0;
  pro->t_appconnect = 0;
  pro->t_pretransfer = 0;
  pro->t_posttransfer = 0;
  pro->t_starttransfer = 0;
  pro->timespent = 0;
  pro->t_redirect = 0;
  pro->is_t_startransfer_set = FALSE;

  info->httpcode = 0;
  info->httpproxycode = 0;
  info->httpversion = 0;
  info->filetime = -1; /* -1 is an illegal time and thus means unknown */
  info->timecond = FALSE;

  info->header_size = 0;
  info->request_size = 0;
  info->proxyauthavail = 0;
  info->httpauthavail = 0;
  info->proxyauthpicked = 0;
  info->httpauthpicked = 0;
  info->numconnects = 0;

  free(info->contenttype);
  info->contenttype = NULL;

  free(info->wouldredirect);
  info->wouldredirect = NULL;

  memset(&info->primary, 0, sizeof(info->primary));
  info->primary.remote_port = -1;
  info->primary.local_port = -1;
  info->retry_after = 0;

  info->conn_scheme = 0;
  info->conn_protocol = 0;

#ifdef USE_SSL
  Curl_ssl_free_certinfo(data);
#endif
  return CURLE_OK;
}